

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form4_ProjectionProfile(ProjectionProfileForm4 ProjectionProfile)

{
  byte value;
  uint uVar1;
  pointer puVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  pointer puVar6;
  bool bVar7;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> projection;
  Image image;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&projection,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&image,value,0,0,(ImageTemplate<unsigned_char> *)&projection);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)&projection);
  Unit_Test::generateRoi(&image,&roiX,&roiY,&roiWidth,&roiHeight);
  uVar1 = rand();
  projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (*ProjectionProfile)(&image,roiX,roiY,roiWidth,roiHeight,(uVar1 & 1) == 0,&projection);
  uVar3 = roiHeight;
  if ((uVar1 & 1) == 0) {
    uVar3 = roiWidth;
    roiWidth = roiHeight;
  }
  lVar4 = (long)projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar4 >> 2 != (ulong)uVar3) {
    bVar7 = false;
    goto LAB_0014408c;
  }
  uVar3 = roiWidth * value;
  puVar2 = projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar5 = lVar4 >> 4; 0 < lVar5; lVar5 = lVar5 + -1) {
    puVar6 = puVar2;
    if (uVar3 != *puVar2) goto LAB_00144086;
    if (uVar3 != puVar2[1]) {
      puVar6 = puVar2 + 1;
      goto LAB_00144086;
    }
    if (uVar3 != puVar2[2]) {
      puVar6 = puVar2 + 2;
      goto LAB_00144086;
    }
    if (uVar3 != puVar2[3]) {
      puVar6 = puVar2 + 3;
      goto LAB_00144086;
    }
    puVar2 = puVar2 + 4;
    lVar4 = lVar4 + -0x10;
  }
  lVar4 = lVar4 >> 2;
  if (lVar4 == 1) {
LAB_0014406b:
    puVar6 = puVar2;
    if (uVar3 == *puVar2) {
      puVar6 = projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  else if (lVar4 == 2) {
LAB_00144063:
    puVar6 = puVar2;
    if (uVar3 == *puVar2) {
      puVar2 = puVar2 + 1;
      goto LAB_0014406b;
    }
  }
  else {
    puVar6 = projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((lVar4 == 3) && (puVar6 = puVar2, uVar3 == *puVar2)) {
      puVar2 = puVar2 + 1;
      goto LAB_00144063;
    }
  }
LAB_00144086:
  bVar7 = puVar6 == projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
LAB_0014408c:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&image);
  return bVar7;
}

Assistant:

bool form4_ProjectionProfile(ProjectionProfileForm4 ProjectionProfile)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image image = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( image, roiX, roiY, roiWidth, roiHeight );

        const bool horizontal = (randomValue<int>(2) == 0);

        std::vector < uint32_t > projection;
        ProjectionProfile( image, roiX, roiY, roiWidth, roiHeight, horizontal, projection );

        const uint32_t value = (horizontal ? roiHeight : roiWidth) * intensity;

        return projection.size() == (horizontal ? roiWidth : roiHeight) &&
            std::all_of( projection.begin(), projection.end(), [&value]( uint32_t v ) { return value == v; } );
    }